

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::ScriptContext::AddCalleeSourceInfoToList(ScriptContext *this,Utf8SourceInfo *sourceInfo)

{
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  Recycler *pRVar1;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_> *pWVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  undefined4 *puVar6;
  Recycler *alloc;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 local_50 [8];
  TrackAllocData data;
  RecyclerWeakReference<Js::Utf8SourceInfo> *sourceInfoWeakRef;
  
  if (sourceInfo == (Utf8SourceInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x19e1,"(sourceInfo)","sourceInfo");
    if (!bVar5) goto LAB_0079bdd4;
    *puVar6 = 0;
  }
  data.line = 0;
  data._36_4_ = 0;
  pRVar1 = this->recycler;
  bVar5 = Memory::WeakReferenceHashTable<PrimePolicy>::FindOrAdd
                    (&pRVar1->weakReferenceMap,(char *)sourceInfo,pRVar1,
                     (RecyclerWeakReferenceBase **)&data.line);
  if (!bVar5) {
    *(undefined ***)(data._32_8_ + 0x20) = &Utf8SourceInfo::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(pRVar1,(RecyclerWeakReferenceBase *)data._32_8_);
  }
  if (data._32_8_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x19e5,"(sourceInfoWeakRef)","sourceInfoWeakRef");
    if (!bVar5) {
LAB_0079bdd4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  this_00 = &this->calleeUtf8SourceInfoList;
  if ((this->calleeUtf8SourceInfoList).ptr ==
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    pRVar1 = this->recycler;
    local_50 = (undefined1  [8])
               &JsUtil::
                List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d86450;
    data.filename._0_4_ = 0x19ea;
    alloc = Memory::Recycler::TrackAllocInfo(pRVar1,(TrackAllocData *)local_50);
    pLVar7 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
    (pLVar7->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_> *)0x0;
    (pLVar7->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    (pLVar7->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).alloc = pRVar1;
    (pLVar7->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f1870;
    pLVar7->increment = 4;
    (pLVar7->removePolicy).
    super_FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
         = -1;
    (pLVar7->removePolicy).lastWeakReferenceCleanupId = pRVar1->weakReferenceCleanupId;
    (pLVar7->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_> *)0x0;
    (pLVar7->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    pLVar7->length = 0;
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
    ::Root(this_00,pLVar7,pRVar1);
  }
  pLVar7 = Memory::
           RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
           ::operator->(this_00);
  uVar8 = (ulong)(pLVar7->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).count;
  bVar5 = 0 < (long)uVar8;
  if (0 < (long)uVar8) {
    pWVar2 = (pLVar7->
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
             ).buffer.ptr;
    if ((RecyclerWeakReference<Js::Utf8SourceInfo> *)data._32_8_ == pWVar2->ptr) {
      return;
    }
    uVar4 = 1;
    do {
      uVar9 = uVar4;
      if (uVar8 == uVar9) break;
      uVar4 = uVar9 + 1;
    } while ((RecyclerWeakReference<Js::Utf8SourceInfo> *)data._32_8_ != pWVar2[uVar9].ptr);
    bVar5 = uVar9 < uVar8;
  }
  if (!bVar5) {
    pLVar7 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(this_00);
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
    ::Add(pLVar7,(RecyclerWeakReference<Js::Utf8SourceInfo> **)&data.line);
  }
  return;
}

Assistant:

void ScriptContext::AddCalleeSourceInfoToList(Utf8SourceInfo* sourceInfo)
    {
        Assert(sourceInfo);

        RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef = nullptr;
        this->GetRecycler()->FindOrCreateWeakReferenceHandle(sourceInfo, &sourceInfoWeakRef);
        Assert(sourceInfoWeakRef);

        if (!calleeUtf8SourceInfoList)
        {
            Recycler *recycler = this->GetRecycler();
            calleeUtf8SourceInfoList.Root(RecyclerNew(recycler, CalleeSourceList, recycler), recycler);
        }

        if (!calleeUtf8SourceInfoList->Contains(sourceInfoWeakRef))
        {
            calleeUtf8SourceInfoList->Add(sourceInfoWeakRef);
        }
    }